

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

double __thiscall HighsLpRelaxation::slackLower(HighsLpRelaxation *this,HighsInt row)

{
  pointer pLVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  pLVar1 = (this->lprows).
           super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>.
           _M_impl.super__Vector_impl_data._M_start + row;
  if (pLVar1->origin == kModel) {
    dVar5 = (this->lpsolver).model_.lp_.row_lower_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[row];
    if (dVar5 <= -INFINITY) {
      _Var2._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      dVar5 = -INFINITY;
      if (*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                             ((long)&(_Var2._M_head_impl)->domain + 0xc0))->
                             super__Vector_base<int,_std::allocator<int>_> + (long)pLVar1->index * 4
                  ) == 0) {
        lVar3 = *(long *)&((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                          ((long)&(_Var2._M_head_impl)->domain + 0x90))->
                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>;
        lVar4 = (long)pLVar1->index * 0x10;
        return *(double *)(lVar3 + lVar4) + *(double *)(lVar3 + 8 + lVar4);
      }
    }
    return dVar5;
  }
  if (pLVar1->origin == kCutPool) {
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar5 = HighsDomain::getMinCutActivity
                      (&(_Var2._M_head_impl)->domain,&(_Var2._M_head_impl)->cutpool,pLVar1->index);
    return dVar5;
  }
  return -INFINITY;
}

Assistant:

double HighsLpRelaxation::slackLower(HighsInt row) const {
  switch (lprows[row].origin) {
    case LpRow::kCutPool:
      return mipsolver.mipdata_->domain.getMinCutActivity(
          mipsolver.mipdata_->cutpool, lprows[row].index);
    case LpRow::kModel:
      double rowlower = rowLower(row);
      if (rowlower != -kHighsInf) return rowlower;
      return mipsolver.mipdata_->domain.getMinActivity(lprows[row].index);
  };

  assert(false);
  return -kHighsInf;
}